

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btOverlappingPairCache.cpp
# Opt level: O2

void * __thiscall
btSortedOverlappingPairCache::removeOverlappingPair
          (btSortedOverlappingPairCache *this,btBroadphaseProxy *proxy0,btBroadphaseProxy *proxy1,
          btDispatcher *dispatcher)

{
  int *piVar1;
  btBroadphasePair *pbVar2;
  void *pvVar3;
  btOverlappingPairCallback *pbVar4;
  int iVar5;
  btBroadphasePair findPair;
  btBroadphasePair local_50;
  
  iVar5 = (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
            _vptr_btOverlappingPairCallback[0xe])();
  if ((char)iVar5 == '\0') {
    local_50.m_pProxy1 = proxy0;
    local_50.m_pProxy0 = proxy1;
    if (proxy0->m_uniqueId < proxy1->m_uniqueId) {
      local_50.m_pProxy1 = proxy1;
      local_50.m_pProxy0 = proxy0;
    }
    local_50.m_algorithm = (btCollisionAlgorithm *)0x0;
    local_50.field_3.m_internalInfo1 = (void *)0x0;
    iVar5 = btAlignedObjectArray<btBroadphasePair>::findLinearSearch
                      (&this->m_overlappingPairArray,&local_50);
    if (iVar5 < (this->m_overlappingPairArray).m_size) {
      gOverlappingPairs = gOverlappingPairs + -1;
      pbVar2 = (this->m_overlappingPairArray).m_data;
      pvVar3 = pbVar2[iVar5].field_3.m_internalInfo1;
      (*(this->super_btOverlappingPairCache).super_btOverlappingPairCallback.
        _vptr_btOverlappingPairCallback[8])(this,pbVar2 + iVar5);
      pbVar4 = this->m_ghostPairCallback;
      if (pbVar4 != (btOverlappingPairCallback *)0x0) {
        (*pbVar4->_vptr_btOverlappingPairCallback[3])(pbVar4,proxy0,proxy1,dispatcher);
      }
      btAlignedObjectArray<btBroadphasePair>::swap
                (&this->m_overlappingPairArray,iVar5,(this->m_overlappingPairArray).m_capacity + -1)
      ;
      piVar1 = &(this->m_overlappingPairArray).m_size;
      *piVar1 = *piVar1 + -1;
      return pvVar3;
    }
  }
  return (void *)0x0;
}

Assistant:

void*	btSortedOverlappingPairCache::removeOverlappingPair(btBroadphaseProxy* proxy0,btBroadphaseProxy* proxy1, btDispatcher* dispatcher )
{
	if (!hasDeferredRemoval())
	{
		btBroadphasePair findPair(*proxy0,*proxy1);

		int findIndex = m_overlappingPairArray.findLinearSearch(findPair);
		if (findIndex < m_overlappingPairArray.size())
		{
			gOverlappingPairs--;
			btBroadphasePair& pair = m_overlappingPairArray[findIndex];
			void* userData = pair.m_internalInfo1;
			cleanOverlappingPair(pair,dispatcher);
			if (m_ghostPairCallback)
				m_ghostPairCallback->removeOverlappingPair(proxy0, proxy1,dispatcher);
			
			m_overlappingPairArray.swap(findIndex,m_overlappingPairArray.capacity()-1);
			m_overlappingPairArray.pop_back();
			return userData;
		}
	}

	return 0;
}